

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall parser::Parser::popOperator(Parser *this,bool isBinary)

{
  stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_> *this_00;
  size_type sVar1;
  _Elt_pointer ppEVar2;
  Expr *e1;
  _Elt_pointer ppVar3;
  Expr *e2;
  Expr *local_30;
  
  this_00 = &this->Operands;
  sVar1 = std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>::size(&this_00->c);
  if (sVar1 < 2 || !isBinary) {
    sVar1 = std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>::size(&this_00->c);
    if (sVar1 == 0) goto LAB_00110bea;
    ppEVar2 = (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppEVar2 ==
        (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppEVar2 = (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    e2 = ppEVar2[-1];
    std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>::pop_back(&this_00->c);
    ppVar3 = (this->Operators).c.
             super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar3 == (this->Operators).c.
                  super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar3 = (this->Operators).c.
               super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
    }
    e1 = (Expr *)0x0;
  }
  else {
    ppEVar2 = (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppEVar2 ==
        (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppEVar2 = (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    e2 = ppEVar2[-1];
    std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>::pop_back(&this_00->c);
    ppEVar2 = (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppEVar2 ==
        (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppEVar2 = (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    e1 = ppEVar2[-1];
    std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>::pop_back(&this_00->c);
    ppVar3 = (this->Operators).c.
             super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar3 == (this->Operators).c.
                  super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar3 = (this->Operators).c.
               super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
    }
  }
  local_30 = mkNode(this,&ppVar3[-1].second,e1,e2);
  std::deque<ast::Expr*,std::allocator<ast::Expr*>>::emplace_back<ast::Expr*>
            ((deque<ast::Expr*,std::allocator<ast::Expr*>> *)this_00,&local_30);
LAB_00110bea:
  std::deque<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>::pop_back
            (&(this->Operators).c);
  return;
}

Assistant:

void Parser::popOperator(bool isBinary)
{

    if(Operands.size() >= 2 && isBinary)
    {
      auto e2 = Operands.top();
      Operands.pop();
      auto e1 = Operands.top();
      Operands.pop();
      Operands.push(mkNode(Operators.top().second, e1, e2));
    }else if(Operands.size() > 0){
        auto e2 = Operands.top();
        Operands.pop();
        Operands.push(mkNode(Operators.top().second, nullptr, e2));
    }
    Operators.pop();
}